

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O0

ColumnMapResult *
duckdb::MapColumn(ClientContext *context,MultiFileColumnDefinition *global_column,
                 ColumnIndex *global_index,
                 vector<duckdb::MultiFileColumnDefinition,_true> *local_columns,ColumnMapper *mapper
                 ,optional_idx top_level_index)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  LogicalTypeId LVar4;
  idx_t column_id;
  size_type sVar5;
  size_type sVar6;
  undefined8 uVar7;
  pointer ppVar8;
  pointer pMVar9;
  pointer this;
  MultiFileColumnDefinition *in_RCX;
  ClientContext *in_RDX;
  Value *in_RSI;
  ColumnMapResult *in_RDI;
  ColumnIndex *in_R8;
  vector<duckdb::MultiFileColumnDefinition,_true> *in_R9;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>,_false,_false>,_bool>
  pVar10;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_unique_ptr<MultiFileIndexMapping>_>_&&>::value,_pair<iterator,_bool>_>
  _Var11;
  templated_unique_single_t bind_data;
  ScalarFunction struct_pack_fun;
  LogicalType default_type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  iterator __end2_1;
  iterator __begin2_1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range2_1;
  child_list_t<LogicalType> default_type_list;
  child_list_t<Value> child_list;
  ColumnMapResult child_map;
  value_type *global_child;
  iterator entry_1;
  const_reference<ColumnIndex> global_child_index;
  bool is_selected;
  idx_t i;
  vector<duckdb::ColumnIndex,_true> child_indexes;
  ColumnIndex *index;
  const_iterator __end2;
  const_iterator __begin2;
  vector<duckdb::ColumnIndex,_true> *__range2;
  unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
  selected_children;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  default_expressions;
  child_list_t<Value> column_mapping;
  child_list_t<LogicalType> *struct_children;
  unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true> nested_mapper;
  idx_t mapping_idx;
  unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
  mapping;
  value_type *local_column;
  MultiFileLocalColumnId local_id;
  optional_idx entry;
  bool is_root;
  ColumnMapResult *result;
  optional_idx in_stack_fffffffffffff7e8;
  ScalarFunction *in_stack_fffffffffffff7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f8;
  Value *in_stack_fffffffffffff800;
  unsigned_long *in_stack_fffffffffffff808;
  ColumnMapResult *in_stack_fffffffffffff820;
  LogicalType *in_stack_fffffffffffff828;
  optional_idx *in_stack_fffffffffffff830;
  const_reference in_stack_fffffffffffff838;
  pointer in_stack_fffffffffffff840;
  undefined6 in_stack_fffffffffffff848;
  undefined1 in_stack_fffffffffffff84e;
  undefined1 in_stack_fffffffffffff84f;
  Value *in_stack_fffffffffffff858;
  string *in_stack_fffffffffffff868;
  Value *in_stack_fffffffffffff870;
  child_list_t<Value> *in_stack_fffffffffffff8f8;
  unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
  *in_stack_fffffffffffff980;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_fffffffffffff988;
  ScalarFunction *in_stack_fffffffffffff990;
  LogicalType *in_stack_fffffffffffff998;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_508;
  undefined1 *local_500;
  LogicalType local_488;
  string local_468 [96];
  string local_408 [144];
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_false>
  local_378;
  undefined1 local_370;
  optional_idx local_2f0 [13];
  Value local_288;
  const_reference local_228;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>,_false>
  local_220;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>,_false>
  local_218;
  reference_wrapper<const_duckdb::ColumnIndex> local_210;
  byte local_201;
  ulong local_200;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>,_false>
  local_1e0;
  undefined1 local_1d8;
  idx_t local_1d0;
  reference local_1c8;
  ColumnIndex *local_1c0;
  __normal_iterator<const_duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
  local_1b8;
  vector<duckdb::ColumnIndex,_true> *local_1b0;
  undefined1 local_170 [54];
  undefined1 local_13a;
  allocator local_139;
  string local_138 [32];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *local_118;
  undefined1 local_110 [8];
  idx_t local_108;
  string local_f8 [104];
  optional_ptr<const_duckdb::MultiFileColumnDefinition,_true> local_90;
  idx_t local_88;
  const_reference local_78;
  MultiFileLocalColumnId local_70;
  undefined4 local_64;
  undefined1 local_60 [24];
  optional_idx local_48;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 uVar12;
  optional_idx top_level_index_00;
  optional_idx local_10 [2];
  
  bVar2 = optional_idx::IsValid(local_10);
  uVar12 = 0;
  ColumnMapResult::ColumnMapResult(in_stack_fffffffffffff820);
  local_48.index =
       (**(code **)((long)&(((in_R9->
                             super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                             ).
                             super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                             ._M_impl.super__Vector_impl_data._M_start)->name).field_2 + 8))
                 (in_R9,in_RDX);
  bVar3 = optional_idx::IsValid(&local_48);
  if (bVar3) {
    column_id = optional_idx::GetIndex(in_stack_fffffffffffff830);
    MultiFileLocalColumnId::MultiFileLocalColumnId(&local_70,column_id);
    MultiFileLocalColumnId::GetId(&local_70);
    local_78 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[]
                         ((vector<duckdb::MultiFileColumnDefinition,_true> *)
                          in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8.index);
    unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
    ::unique_ptr((unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                  *)0x155ed43);
    if ((bVar2 & 1) == 0) {
      local_88 = MultiFileLocalColumnId::GetId(&local_70);
    }
    else {
      local_88 = optional_idx::GetIndex(in_stack_fffffffffffff830);
    }
    optional_ptr<const_duckdb::MultiFileColumnDefinition,_true>::optional_ptr(&local_90,local_78);
    (in_RDI->local_column).ptr = local_90.ptr;
    make_uniq<duckdb::MultiFileIndexMapping,unsigned_long&>(in_stack_fffffffffffff808);
    unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
    ::operator=((unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                 *)in_stack_fffffffffffff7f0,
                (unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                 *)in_stack_fffffffffffff7e8.index);
    unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                   *)0x155ee22);
    LVar4 = LogicalType::id((LogicalType *)&in_RDX->interrupted);
    if ((LVar4 != STRUCT) ||
       (bVar3 = ::std::
                vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                ::empty((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                         *)in_stack_fffffffffffff800), bVar3)) {
      ::std::__cxx11::string::string(local_f8,(string *)local_78);
      Value::Value(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      Value::operator=((Value *)in_stack_fffffffffffff7f0,(Value *)in_stack_fffffffffffff7e8.index);
      Value::~Value((Value *)in_stack_fffffffffffff7f0);
      ::std::__cxx11::string::~string(local_f8);
      local_108 = MultiFileLocalColumnId::GetId(&local_70);
      make_uniq<duckdb::ColumnIndex,unsigned_long>(in_stack_fffffffffffff808);
      unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true>::operator=
                ((unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true> *)
                 in_stack_fffffffffffff7f0,
                 (unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true> *)
                 in_stack_fffffffffffff7e8.index);
      unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true>::~unique_ptr
                ((unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true> *)
                 0x155ef2a);
      unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
      ::operator=((unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                   *)in_stack_fffffffffffff7f0,
                  (unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                   *)in_stack_fffffffffffff7e8.index);
      bVar2 = 1;
      local_64 = 1;
    }
    else {
      (*(code *)(((in_R9->
                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                  ).
                  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start)->name).field_2._M_allocated_capacity)
                (local_110,in_R9,&local_78->children);
      local_118 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)StructType::GetChildTypes_abi_cxx11_((LogicalType *)in_stack_fffffffffffff7f0);
      sVar5 = ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::size(local_118);
      sVar6 = ::std::
              vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              ::size((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                      *)&in_RDX->config);
      if (sVar5 != sVar6) {
        local_13a = 1;
        uVar7 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_138,
                   "Mismatch between field id children in global_column.children and struct children in type"
                   ,&local_139);
        InvalidInputException::InvalidInputException
                  ((InvalidInputException *)in_stack_fffffffffffff7f0,
                   (string *)in_stack_fffffffffffff7e8.index);
        local_13a = 0;
        __cxa_throw(uVar7,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                *)0x155f121);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)0x155f12e);
      ::std::
      unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
      ::unordered_map((unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
                       *)0x155f13b);
      bVar3 = ColumnIndex::HasChildren((ColumnIndex *)0x155f148);
      if (bVar3) {
        local_1b0 = ColumnIndex::GetChildIndexes((ColumnIndex *)in_RCX);
        local_1b8._M_current =
             (ColumnIndex *)
             ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::begin
                       ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                        in_stack_fffffffffffff7e8.index);
        local_1c0 = (ColumnIndex *)
                    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::end
                              ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                               in_stack_fffffffffffff7e8.index);
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
                                   *)in_stack_fffffffffffff7f0,
                                  (__normal_iterator<const_duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
                                   *)in_stack_fffffffffffff7e8.index), bVar3) {
          local_1c8 = __gnu_cxx::
                      __normal_iterator<const_duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
                      ::operator*(&local_1b8);
          local_1d0 = ColumnIndex::GetPrimaryIndex(local_1c8);
          pVar10 = ::std::
                   unordered_map<unsigned_long,std::reference_wrapper<duckdb::ColumnIndex_const>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<duckdb::ColumnIndex_const>>>>
                   ::emplace<unsigned_long,duckdb::ColumnIndex_const&>
                             ((unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
                               *)in_stack_fffffffffffff800,
                              (unsigned_long *)in_stack_fffffffffffff7f8,
                              (ColumnIndex *)in_stack_fffffffffffff7f0);
          local_1e0._M_cur =
               (__node_type *)
               pVar10.first.
               super__Node_iterator_base<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>,_false>
               ._M_cur;
          local_1d8 = pVar10.second;
          __gnu_cxx::
          __normal_iterator<const_duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
          ::operator++(&local_1b8);
        }
      }
      vector<duckdb::ColumnIndex,_true>::vector((vector<duckdb::ColumnIndex,_true> *)0x155f292);
      for (local_200 = 0; uVar1 = local_200,
          sVar5 = ::std::
                  vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                  ::size((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                          *)&in_RDX->config), uVar1 < sVar5; local_200 = local_200 + 1) {
        local_201 = 1;
        ::std::reference_wrapper<duckdb::ColumnIndex_const>::
        reference_wrapper<duckdb::ColumnIndex_const&,void,duckdb::ColumnIndex_const*>
                  ((reference_wrapper<const_duckdb::ColumnIndex> *)in_stack_fffffffffffff7f0,
                   (ColumnIndex *)in_stack_fffffffffffff7e8.index);
        bVar3 = ::std::
                unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
                ::empty((unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
                         *)0x155f2fd);
        if (!bVar3) {
          local_218._M_cur =
               (__node_type *)
               ::std::
               unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
               ::find((unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
                       *)in_stack_fffffffffffff7e8.index,(key_type *)0x155f31a);
          local_220._M_cur =
               (__node_type *)
               ::std::
               unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
               ::end((unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
                      *)in_stack_fffffffffffff7e8.index);
          bVar3 = ::std::__detail::operator!=(&local_218,&local_220);
          if (bVar3) {
            ppVar8 = ::std::__detail::
                     _Node_iterator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>,_false,_false>
                     ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>,_false,_false>
                                   *)0x155f371);
            local_210._M_data = (ppVar8->second)._M_data;
          }
          else {
            local_201 = 0;
          }
        }
        local_228 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[]
                              ((vector<duckdb::MultiFileColumnDefinition,_true> *)
                               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8.index);
        ColumnMapResult::ColumnMapResult(in_stack_fffffffffffff820);
        if ((local_201 & 1) == 0) {
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_fffffffffffff7f0,
                     (LogicalType *)in_stack_fffffffffffff7e8.index);
          Value::Value(in_stack_fffffffffffff800,(LogicalType *)in_stack_fffffffffffff7f8);
          make_uniq<duckdb::BoundConstantExpression,duckdb::Value>(in_stack_fffffffffffff858);
          unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
          unique_ptr<duckdb::BoundConstantExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffff7f0,
                     (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
                      *)in_stack_fffffffffffff7e8.index);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffff7f0,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffff7e8.index);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)0x155f56a);
          unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
          ::~unique_ptr((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                         *)0x155f577);
          Value::~Value((Value *)in_stack_fffffffffffff7f0);
          LogicalType::~LogicalType((LogicalType *)0x155f591);
        }
        else {
          top_level_index_00.index = (idx_t)in_RSI;
          ::std::reference_wrapper<const_duckdb::ColumnIndex>::get(&local_210);
          unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>::
          operator*((unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>
                     *)in_stack_fffffffffffff7f0);
          optional_idx::optional_idx(local_2f0);
          in_stack_fffffffffffff7e8.index = local_2f0[0].index;
          MapColumn(in_RDX,in_RCX,in_R8,in_R9,
                    (ColumnMapper *)CONCAT17(bVar2,CONCAT16(uVar12,in_stack_ffffffffffffffc0)),
                    top_level_index_00);
          ColumnMapResult::operator=
                    ((ColumnMapResult *)in_stack_fffffffffffff7f0,
                     (ColumnMapResult *)in_stack_fffffffffffff7e8.index);
          ColumnMapResult::~ColumnMapResult((ColumnMapResult *)in_stack_fffffffffffff7f0);
          in_stack_fffffffffffff870 = in_RSI;
          in_RSI = (Value *)top_level_index_00.index;
        }
        bVar3 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>_>
                            *)0x155f5ed);
        if (bVar3) {
          in_stack_fffffffffffff868 =
               (string *)
               unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true>::
               operator*((unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true>
                          *)in_stack_fffffffffffff7f0);
          ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::push_back
                    ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                     in_stack_fffffffffffff7f0,(value_type *)in_stack_fffffffffffff7e8.index);
          pMVar9 = unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                   ::operator->((unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                                 *)in_stack_fffffffffffff7f0);
          in_stack_fffffffffffff858 = (Value *)&pMVar9->child_mapping;
          ::std::
          make_pair<unsigned_long&,duckdb::unique_ptr<duckdb::MultiFileIndexMapping,std::default_delete<duckdb::MultiFileIndexMapping>,true>>
                    ((unsigned_long *)in_stack_fffffffffffff7f8,
                     (unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                      *)in_stack_fffffffffffff7f0);
          _Var11 = ::std::
                   unordered_map<unsigned_long,duckdb::unique_ptr<duckdb::MultiFileIndexMapping,std::default_delete<duckdb::MultiFileIndexMapping>,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::MultiFileIndexMapping,std::default_delete<duckdb::MultiFileIndexMapping>,true>>>>
                   ::
                   insert<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::MultiFileIndexMapping,std::default_delete<duckdb::MultiFileIndexMapping>,true>>>
                             ((unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>_>
                               *)in_stack_fffffffffffff800,
                              (pair<unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>
                               *)in_stack_fffffffffffff7f8);
          local_378._M_cur =
               (__node_type *)
               _Var11.first.
               super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_false>
               ._M_cur;
          in_stack_fffffffffffff84f = _Var11.second;
          local_370 = in_stack_fffffffffffff84f;
          ::std::
          pair<unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>
          ::~pair((pair<unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>
                   *)0x155f6a7);
        }
        in_stack_fffffffffffff84e = Value::IsNull(&local_288);
        if (!(bool)in_stack_fffffffffffff84e) {
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
          ::emplace_back<std::__cxx11::string_const&,duckdb::Value>
                    ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                      *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                     (Value *)in_stack_fffffffffffff7f0);
        }
        bVar3 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            *)0x155f71e);
        if (bVar3) {
          in_stack_fffffffffffff838 = local_228;
          in_stack_fffffffffffff840 =
               unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffff7f0);
          ::std::__cxx11::string::operator=
                    ((string *)&(in_stack_fffffffffffff840->super_BaseExpression).alias,
                     (string *)in_stack_fffffffffffff838);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)in_stack_fffffffffffff7f0,(value_type *)in_stack_fffffffffffff7e8.index);
        }
        ColumnMapResult::~ColumnMapResult((ColumnMapResult *)in_stack_fffffffffffff7f0);
      }
      bVar3 = ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
              ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                       *)in_stack_fffffffffffff800);
      if (!bVar3) {
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                  *)in_stack_fffffffffffff7f0,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                  *)in_stack_fffffffffffff7e8.index);
        Value::STRUCT(in_stack_fffffffffffff8f8);
        Value::operator=((Value *)in_stack_fffffffffffff7f0,(Value *)in_stack_fffffffffffff7e8.index
                        );
        Value::~Value((Value *)in_stack_fffffffffffff7f0);
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                   *)0x155f81d);
        if ((bVar2 & 1) == 0) {
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                    *)0x155f838);
          ::std::__cxx11::string::string(local_408);
          ::std::__cxx11::string::string(local_468,(string *)local_78);
          Value::Value(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
          ::emplace_back<std::__cxx11::string,duckdb::Value>
                    ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                      *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                     (Value *)in_stack_fffffffffffff7f0);
          Value::~Value((Value *)in_stack_fffffffffffff7f0);
          ::std::__cxx11::string::~string(local_468);
          ::std::__cxx11::string::~string(local_408);
          in_stack_fffffffffffff828 = &local_488;
          ::std::__cxx11::string::string((string *)in_stack_fffffffffffff828);
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
          ::emplace_back<std::__cxx11::string,duckdb::Value>
                    ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                      *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                     (Value *)in_stack_fffffffffffff7f0);
          ::std::__cxx11::string::~string((string *)&local_488);
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                    *)in_stack_fffffffffffff7f0,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                    *)in_stack_fffffffffffff7e8.index);
          Value::STRUCT(in_stack_fffffffffffff8f8);
          Value::operator=((Value *)in_stack_fffffffffffff7f0,
                           (Value *)in_stack_fffffffffffff7e8.index);
          Value::~Value((Value *)in_stack_fffffffffffff7f0);
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                     *)0x155f951);
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                     *)0x155f95e);
        }
      }
      bVar3 = std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::empty((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)in_stack_fffffffffffff800);
      if (!bVar3) {
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  *)0x155fa6c);
        local_500 = local_170;
        local_508._M_current =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             ::std::
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      *)in_stack_fffffffffffff7e8.index);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)in_stack_fffffffffffff7e8.index);
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                   *)in_stack_fffffffffffff7f0,
                                  (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                   *)in_stack_fffffffffffff7e8.index), bVar3) {
          __gnu_cxx::
          __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
          ::operator*(&local_508);
          this = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)in_stack_fffffffffffff7f0);
          BaseExpression::GetAlias_abi_cxx11_(&this->super_BaseExpression);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffff7f0);
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
          ::emplace_back<std::__cxx11::string_const&,duckdb::LogicalType&>
                    ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                      *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                     (LogicalType *)in_stack_fffffffffffff7f0);
          __gnu_cxx::
          __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
          ::operator++(&local_508);
        }
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  *)in_stack_fffffffffffff7f0,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  *)in_stack_fffffffffffff7e8.index);
        LogicalType::STRUCT((child_list_t<LogicalType> *)in_stack_fffffffffffff838);
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                   *)0x155fb97);
        StructPackFun::GetFunction();
        make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>(in_stack_fffffffffffff828);
        make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::VariableReturnBindData,std::default_delete<duckdb::VariableReturnBindData>,true>>
                  (in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                   in_stack_fffffffffffff980);
        unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
        unique_ptr<duckdb::BoundFunctionExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff7f0,
                   (unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>_>
                    *)in_stack_fffffffffffff7e8.index);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff7f0,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffff7e8.index);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0x155fc27);
        unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
        ::~unique_ptr((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                       *)0x155fc34);
        unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
        ::~unique_ptr((unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
                       *)0x155fc41);
        ScalarFunction::~ScalarFunction(in_stack_fffffffffffff7f0);
        LogicalType::~LogicalType((LogicalType *)0x155fc5b);
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                   *)0x155fc68);
      }
      MultiFileLocalColumnId::GetId(&local_70);
      make_uniq<duckdb::ColumnIndex,unsigned_long,duckdb::vector<duckdb::ColumnIndex,true>>
                ((unsigned_long *)
                 CONCAT17(in_stack_fffffffffffff84f,
                          CONCAT16(in_stack_fffffffffffff84e,in_stack_fffffffffffff848)),
                 (vector<duckdb::ColumnIndex,_true> *)in_stack_fffffffffffff840);
      unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true>::operator=
                ((unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true> *)
                 in_stack_fffffffffffff7f0,
                 (unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true> *)
                 in_stack_fffffffffffff7e8.index);
      unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true>::~unique_ptr
                ((unique_ptr<duckdb::ColumnIndex,_std::default_delete<duckdb::ColumnIndex>,_true> *)
                 0x155fd6f);
      unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
      ::operator=((unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                   *)in_stack_fffffffffffff7f0,
                  (unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                   *)in_stack_fffffffffffff7e8.index);
      bVar2 = 1;
      local_64 = 1;
      vector<duckdb::ColumnIndex,_true>::~vector((vector<duckdb::ColumnIndex,_true> *)0x155fda8);
      ::std::
      unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
      ::~unordered_map((unordered_map<unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<const_duckdb::ColumnIndex>_>_>_>
                        *)0x155fdb5);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 *)0x155fdc2);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                 *)0x155fdcf);
      unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>::~unique_ptr
                ((unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>
                  *)0x155fddc);
    }
    unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                   *)0x155fe2e);
  }
  else {
    (**(code **)&((in_R9->
                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                  ).
                  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start)->type)(local_60,in_R9,in_RDX,bVar2 & 1)
    ;
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffff7f0,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffff7e8.index);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0x155ec81);
    bVar2 = 1;
    local_64 = 1;
  }
  if ((bVar2 & 1) == 0) {
    ColumnMapResult::~ColumnMapResult((ColumnMapResult *)in_stack_fffffffffffff7f0);
  }
  return in_RDI;
}

Assistant:

ColumnMapResult MapColumn(ClientContext &context, const MultiFileColumnDefinition &global_column,
                          const ColumnIndex &global_index, const vector<MultiFileColumnDefinition> &local_columns,
                          const ColumnMapper &mapper, optional_idx top_level_index = optional_idx()) {
	bool is_root = top_level_index.IsValid();
	ColumnMapResult result;
	auto entry = mapper.Find(global_column);
	if (!entry.IsValid()) {
		// entry not present in map, use default value
		result.default_value = mapper.GetDefaultExpression(global_column, is_root);
		return result;
	}
	// the field exists! get the local column
	MultiFileLocalColumnId local_id(entry.GetIndex());
	auto &local_column = local_columns[local_id.GetId()];
	unique_ptr<MultiFileIndexMapping> mapping;
	idx_t mapping_idx;
	if (is_root) {
		// root expression - refer to it directly
		mapping_idx = top_level_index.GetIndex();
	} else {
		// extract the field from the parent
		mapping_idx = local_id.GetId();
	}
	result.local_column = local_column;
	mapping = make_uniq<MultiFileIndexMapping>(mapping_idx);
	if (global_column.type.id() != LogicalTypeId::STRUCT || global_column.children.empty()) {
		// not a struct - map the column directly
		result.column_map = Value(local_column.name);
		result.column_index = make_uniq<ColumnIndex>(local_id.GetId());
		result.mapping = std::move(mapping);
		return result;
	}
	// nested type - check if the field identifiers match and if we need to remap
	auto nested_mapper = mapper.Create(local_column.children);
	auto &struct_children = StructType::GetChildTypes(global_column.type);
	if (struct_children.size() != global_column.children.size()) {
		throw InvalidInputException(
		    "Mismatch between field id children in global_column.children and struct children in type");
	}
	child_list_t<Value> column_mapping;
	vector<unique_ptr<Expression>> default_expressions;
	unordered_map<idx_t, const_reference<ColumnIndex>> selected_children;
	if (global_index.HasChildren()) {
		for (auto &index : global_index.GetChildIndexes()) {
			selected_children.emplace(index.GetPrimaryIndex(), index);
		}
	}

	vector<ColumnIndex> child_indexes;
	for (idx_t i = 0; i < global_column.children.size(); i++) {
		bool is_selected = true;
		const_reference<ColumnIndex> global_child_index = global_index;
		if (!selected_children.empty()) {
			auto entry = selected_children.find(i);
			if (entry != selected_children.end()) {
				// the column is relevent - set the child index
				global_child_index = entry->second;
			} else {
				// not relevant - ignore the column
				is_selected = false;
			}
		}
		auto &global_child = global_column.children[i];
		ColumnMapResult child_map;
		if (is_selected) {
			child_map =
			    MapColumn(context, global_child, global_child_index.get(), local_column.children, *nested_mapper);
		} else {
			// column is not relevant for the query - push a NULL value
			child_map.default_value = make_uniq<BoundConstantExpression>(Value(global_child.type));
		}
		if (child_map.column_index) {
			child_indexes.push_back(std::move(*child_map.column_index));
			mapping->child_mapping.insert(make_pair(i, std::move(child_map.mapping)));
		}
		if (!child_map.column_map.IsNull()) {
			// found a column mapping for this child - emplace it
			column_mapping.emplace_back(global_child.name, std::move(child_map.column_map));
		}
		if (child_map.default_value) {
			// found a default value for this child - emplace it
			child_map.default_value->alias = global_child.name;
			default_expressions.push_back(std::move(child_map.default_value));
		}
	}
	if (!column_mapping.empty()) {
		// we have column mappings at this level - construct the struct
		result.column_map = Value::STRUCT(std::move(column_mapping));
		if (!is_root) {
			// if this is nested we need to refer to the current column at this level
			child_list_t<Value> child_list;
			child_list.emplace_back(string(), Value(local_column.name));
			child_list.emplace_back(string(), std::move(result.column_map));
			result.column_map = Value::STRUCT(std::move(child_list));
		}
	}
	if (!default_expressions.empty()) {
		// we have default values at this level - construct the struct pack
		child_list_t<LogicalType> default_type_list;
		for (auto &expr : default_expressions) {
			default_type_list.emplace_back(expr->GetAlias(), expr->return_type);
		}
		auto default_type = LogicalType::STRUCT(std::move(default_type_list));
		auto struct_pack_fun = StructPackFun::GetFunction();
		auto bind_data = make_uniq<VariableReturnBindData>(default_type);
		result.default_value = make_uniq<BoundFunctionExpression>(std::move(default_type), std::move(struct_pack_fun),
		                                                          std::move(default_expressions), std::move(bind_data));
	}
	result.column_index = make_uniq<ColumnIndex>(local_id.GetId(), std::move(child_indexes));
	result.mapping = std::move(mapping);
	return result;
}